

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction.cpp
# Opt level: O2

string * __thiscall
cfd::api::TransactionApi::CreateSignatureHash
          (string *__return_storage_ptr__,TransactionApi *this,string *tx_hex,Txid *txid,
          uint32_t vout,ByteData *key_data,Amount *amount,HashType hash_type,
          SigHashType *sighash_type)

{
  HashType HVar1;
  SigHashType *sighash_type_00;
  string *psVar2;
  CfdException *this_00;
  WitnessVersion version;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_120;
  string *local_108;
  ByteData sig_hash;
  Script local_e8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  SigHashType local_98;
  SigHashType local_8c;
  TransactionController txc;
  
  HVar1 = hash_type;
  local_108 = __return_storage_ptr__;
  core::ByteData::ByteData(&sig_hash);
  TransactionController::TransactionController(&txc,tx_hex);
  sighash_type_00 = sighash_type;
  if (HVar1 < 4) {
    version = -(uint)((HVar1 & ~kP2sh) != kP2wpkh);
    switch(HVar1) {
    default:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b0,&key_data->data_
                );
      core::Pubkey::Pubkey((Pubkey *)&local_120,(ByteData *)&local_b0);
      core::SigHashType::SigHashType(&local_8c,sighash_type_00);
      TransactionController::CreateSignatureHash
                ((ByteData *)&local_e8,&txc,txid,vout,(Pubkey *)&local_120,&local_8c,amount,version)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sig_hash,&local_e8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_120);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b0);
      break;
    case kP2sh:
    case kP2wsh:
      core::Script::Script(&local_e8,key_data);
      core::SigHashType::SigHashType(&local_98,sighash_type_00);
      TransactionController::CreateSignatureHash
                ((ByteData *)&local_120,&txc,txid,vout,&local_e8,&local_98,amount,version);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sig_hash,&local_120);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_120);
      core::Script::~Script(&local_e8);
    }
    psVar2 = local_108;
    core::ByteData::GetHex_abi_cxx11_(local_108,&sig_hash);
    TransactionController::~TransactionController(&txc);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig_hash);
    return psVar2;
  }
  local_e8._vptr_Script = (_func_int **)0x4f90cd;
  local_e8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb3;
  local_e8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "CreateSignatureHash";
  core::logger::warn<cfd::core::HashType&>
            ((CfdSourceLocation *)&local_e8,
             "Failed to CreateSignatureHash. Invalid hash_type: hash_type={}",&hash_type);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_e8,
             "Invalid hash_type. hash_type must be \"p2pkh\"(0) or \"p2sh\"(1) or \"p2wpkh\"(2) or \"p2wsh\"(3)."
             ,(allocator *)&local_120);
  core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&local_e8);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

std::string TransactionApi::CreateSignatureHash(
    const std::string& tx_hex, const Txid& txid, uint32_t vout,
    const ByteData& key_data, const Amount& amount, HashType hash_type,
    const SigHashType& sighash_type) const {
  ByteData sig_hash;
  TransactionController txc(tx_hex);
  WitnessVersion version = WitnessVersion::kVersionNone;
  if ((hash_type == HashType::kP2wpkh) || (hash_type == HashType::kP2wsh)) {
    version = WitnessVersion::kVersion0;
  }

  switch (hash_type) {
    case HashType::kP2pkh:
      // fall-through
    case HashType::kP2wpkh:
      sig_hash = txc.CreateSignatureHash(
          txid, vout, Pubkey(key_data), sighash_type, amount, version);
      break;
    case HashType::kP2sh:
      // fall-through
    case HashType::kP2wsh:
      sig_hash = txc.CreateSignatureHash(
          txid, vout, Script(key_data), sighash_type, amount, version);
      break;
    default:
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateSignatureHash. Invalid hash_type: "
          "hash_type={}",  // NOLINT
          hash_type);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid hash_type. hash_type must be \"p2pkh\"(0) "
          "or \"p2sh\"(1) or \"p2wpkh\"(2) or \"p2wsh\"(3).");  // NOLINT
  }

  return sig_hash.GetHex();
}